

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O0

void __thiscall swrenderer::Stat_wallcycles::~Stat_wallcycles(Stat_wallcycles *this)

{
  Stat_wallcycles *this_local;
  
  ~Stat_wallcycles(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

ADD_STAT (wallcycles)
{
	FString out;
	double cycles = WallCycles.Time();
	if (cycles && cycles < bestwallcycles)
		bestwallcycles = cycles;
	out.Format ("%g", bestwallcycles);
	return out;
}